

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O2

LPVOID VirtualAlloc_(LPVOID lpAddress,SIZE_T dwSize,DWORD flAllocationType,DWORD flProtect)

{
  int iVar1;
  CPalThread *pThread;
  int *piVar2;
  LPVOID pvVar3;
  char *__format;
  
  if ((VirtualAlloc_(void*,unsigned_long,unsigned_int,unsigned_int)::was_pal_initialized == '\0') &&
     (iVar1 = __cxa_guard_acquire(&VirtualAlloc_(void*,unsigned_long,unsigned_int,unsigned_int)::
                                   was_pal_initialized), iVar1 != 0)) {
    VirtualAlloc_::was_pal_initialized = PAL_Initialize_Check_Once();
    __cxa_guard_release(&VirtualAlloc_(void*,unsigned_long,unsigned_int,unsigned_int)::
                         was_pal_initialized);
  }
  if (VirtualAlloc_::was_pal_initialized == false) {
    fprintf(_stderr,"] %s %s:%d","VirtualAlloc_",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x6b3);
    fprintf(_stderr,"Expression: was_pal_initialized\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012ee2b;
  pThread = CorUnix::InternalGetCurrentThread();
  if ((flAllocationType >> 0x15 & 1) == 0) {
    if ((flAllocationType & 0xbfcfcfff) == 0) {
      if ((flProtect & 0xffffff88) == 0) {
        if (((flAllocationType >> 0x14 & 1) != 0) && (PAL_InitializeChakraCoreCalled == false))
        goto LAB_0012ee2b;
        if ((flAllocationType >> 0xd & 1) == 0) {
          pvVar3 = (LPVOID)0x0;
        }
        else {
          CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
          pvVar3 = VIRTUALReserveMemory(pThread,lpAddress,dwSize,flAllocationType,flProtect);
          CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
          if (pvVar3 == (LPVOID)0x0) goto LAB_0012ed01;
        }
        if ((flAllocationType >> 0xc & 1) != 0) {
          CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
          if (pvVar3 != (LPVOID)0x0) {
            lpAddress = pvVar3;
          }
          pvVar3 = VIRTUALCommitMemory(pThread,lpAddress,dwSize,flAllocationType,flProtect);
          CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
        }
        goto LAB_0012ed59;
      }
      fprintf(_stderr,"] %s %s:%d","VirtualAlloc_",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
              ,0x6d0);
      __format = 
      "flProtect can be one of PAGE_READONLY, PAGE_READWRITE, or                PAGE_EXECUTE_READWRITE || PAGE_NOACCESS. \n"
      ;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","VirtualAlloc_",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
              ,0x6c9);
      __format = 
      "flAllocationType can be one, or any combination of MEM_COMMIT,                MEM_RESERVE, MEM_TOP_DOWN, or MEM_RESERVE_EXECUTABLE.\n"
      ;
    }
    pvVar3 = (LPVOID)0x0;
    fprintf(_stderr,__format);
    piVar2 = __errno_location();
    *piVar2 = 0x57;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x57;
LAB_0012ed01:
    pvVar3 = (LPVOID)0x0;
  }
LAB_0012ed59:
  if (PAL_InitializeChakraCoreCalled != false) {
    return pvVar3;
  }
LAB_0012ee2b:
  abort();
}

Assistant:

LPVOID
VirtualAlloc_(
         IN LPVOID lpAddress,       /* Region to reserve or commit */
         IN SIZE_T dwSize,          /* Size of Region */
         IN DWORD flAllocationType, /* Type of allocation */
         IN DWORD flProtect)        /* Type of access protection */
{
#ifdef DEBUG
    static bool was_pal_initialized = PAL_Initialize_Check_Once();
    _ASSERTE(was_pal_initialized);
#endif

    LPVOID  pRetVal       = NULL;
    CPalThread *pthrCurrent;

    PERF_ENTRY(VirtualAlloc);
    ENTRY("VirtualAlloc(lpAddress=%p, dwSize=%u, flAllocationType=%#x, \
          flProtect=%#x)\n", lpAddress, dwSize, flAllocationType, flProtect);

    pthrCurrent = InternalGetCurrentThread();

    if ( ( flAllocationType & MEM_WRITE_WATCH )  != 0 )
    {
        pthrCurrent->SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    /* Test for un-supported flags. */
    if ( ( flAllocationType & ~( MEM_COMMIT | MEM_RESERVE | MEM_TOP_DOWN | MEM_RESERVE_EXECUTABLE ) ) != 0 )
    {
        ASSERT( "flAllocationType can be one, or any combination of MEM_COMMIT, \
               MEM_RESERVE, MEM_TOP_DOWN, or MEM_RESERVE_EXECUTABLE.\n" );
        pthrCurrent->SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }
    if ( VIRTUALContainsInvalidProtectionFlags( flProtect ) )
    {
        ASSERT( "flProtect can be one of PAGE_READONLY, PAGE_READWRITE, or \
               PAGE_EXECUTE_READWRITE || PAGE_NOACCESS. \n" );

        pthrCurrent->SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }
    if ( flAllocationType & MEM_TOP_DOWN )
    {
        WARN( "Ignoring the allocation flag MEM_TOP_DOWN.\n" );
    }

#if RESERVE_FROM_BACKING_FILE
    // Make sure we have memory to map before we try to use it.
    VIRTUALGetBackingFile(pthrCurrent);
#endif  // RESERVE_FROM_BACKING_FILE

    if ( flAllocationType & MEM_RESERVE )
    {
        InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);
        pRetVal = VIRTUALReserveMemory( pthrCurrent, lpAddress, dwSize, flAllocationType, flProtect );
        InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);

        if ( !pRetVal )
        {
            /* Error messages are already displayed, just leave. */
            goto done;
        }
    }

    if ( flAllocationType & MEM_COMMIT )
    {
        InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);
        if ( pRetVal != NULL )
        {
            /* We are reserving and committing. */
            pRetVal = VIRTUALCommitMemory( pthrCurrent, pRetVal, dwSize,
                                    flAllocationType, flProtect );
        }
        else
        {
            /* Just a commit. */
            pRetVal = VIRTUALCommitMemory( pthrCurrent, lpAddress, dwSize,
                                    flAllocationType, flProtect );
        }
        InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);
    }

done:
    LOGEXIT("VirtualAlloc returning %p\n ", pRetVal  );
    PERF_EXIT(VirtualAlloc);
    return pRetVal;
}